

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O1

bool __thiscall tinyusdz::crate::CrateReader::ReadIndex(CrateReader *this,Index *i)

{
  bool bVar1;
  ulong uVar2;
  ostream *poVar3;
  long lVar4;
  char *pcVar5;
  uint32_t value;
  ostringstream ss_e;
  Index local_1ac;
  long *local_1a8;
  long local_198 [2];
  ostringstream local_188 [112];
  ios_base local_118 [264];
  
  bVar1 = StreamReader::read4(this->_sr,&local_1ac.value);
  if (bVar1) {
    uVar2 = this->_memoryUsage + 4;
    this->_memoryUsage = uVar2;
    if (uVar2 <= (this->_config).maxMemoryBudget) {
      i->value = (uint32_t)local_1ac;
      return true;
    }
    ::std::__cxx11::ostringstream::ostringstream(local_188);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_188,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,"[Crate]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,"ReadIndex",9);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,"():",3);
    poVar3 = (ostream *)::std::ostream::operator<<(local_188,0xcd);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    pcVar5 = "Reached to max memory budget.";
    lVar4 = 0x1d;
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream(local_188);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_188,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,"ReadIndex",9);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,"():",3);
    poVar3 = (ostream *)::std::ostream::operator<<(local_188,0xc9);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    pcVar5 = "Failed to read Index";
    lVar4 = 0x14;
  }
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,pcVar5,lVar4);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,"\n",1);
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_1a8);
  if (local_1a8 != local_198) {
    operator_delete(local_1a8,local_198[0] + 1);
  }
  ::std::__cxx11::ostringstream::~ostringstream(local_188);
  ::std::ios_base::~ios_base(local_118);
  return false;
}

Assistant:

bool CrateReader::ReadIndex(crate::Index *i) {
  // string is serialized as StringIndex
  uint32_t value;
  if (!_sr->read4(&value)) {
    PUSH_ERROR("Failed to read Index");
    return false;
  }

  CHECK_MEMORY_USAGE(sizeof(uint32_t));

  (*i) = crate::Index(value);
  return true;
}